

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ExternUdpDeclSyntax *pEVar1;
  Token TVar2;
  Token *unaff_retaddr;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000008;
  BumpAllocator *in_stack_00000010;
  UdpPortListSyntax *in_stack_00000020;
  BumpAllocator *in_stack_00000048;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000050;
  BumpAllocator *in_stack_000000e8;
  Token *in_stack_000000f0;
  BumpAllocator *in_stack_ffffffffffffff98;
  UdpPortListSyntax *in_stack_ffffffffffffffa0;
  Token *args_4;
  
  deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000050,in_stack_00000048);
  TVar2 = parsing::Token::deepClone(in_stack_000000f0,in_stack_000000e8);
  args_4 = (Token *)TVar2.info;
  deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000050,in_stack_00000048);
  parsing::Token::deepClone(in_stack_000000f0,in_stack_000000e8);
  parsing::Token::deepClone(in_stack_000000f0,in_stack_000000e8);
  not_null<slang::syntax::UdpPortListSyntax_*>::operator*
            ((not_null<slang::syntax::UdpPortListSyntax_*> *)0xa57296);
  deepClone<slang::syntax::UdpPortListSyntax>(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  pEVar1 = BumpAllocator::
           emplace<slang::syntax::ExternUdpDeclSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::syntax::UdpPortListSyntax&>
                     (in_stack_00000010,in_stack_00000008,unaff_retaddr,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)__fn,
                      (Token *)__child_stack,args_4,in_stack_00000020);
  return (int)pEVar1;
}

Assistant:

static SyntaxNode* clone(const ExternUdpDeclSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ExternUdpDeclSyntax>(
        *deepClone(node.attributes, alloc),
        node.externKeyword.deepClone(alloc),
        *deepClone(node.actualAttributes, alloc),
        node.primitive.deepClone(alloc),
        node.name.deepClone(alloc),
        *deepClone<UdpPortListSyntax>(*node.portList, alloc)
    );
}